

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

JavascriptArray * Js::JavascriptNativeFloatArray::ToVarArray(JavascriptNativeFloatArray *fArray)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  ArrayCallSiteInfo *this;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  FunctionInfo *pFVar7;
  undefined1 uVar8;
  undefined1 local_f0 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *local_40;
  JavascriptFunction *caller;
  
  pTVar1 = ((((((fArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  uVar8 = pTVar1->noJsReentrancy;
  pTVar1->noJsReentrancy = true;
  this = JavascriptNativeArray::GetArrayCallSiteInfo(&fArray->super_JavascriptNativeArray);
  if (this != (ArrayCallSiteInfo *)0x0) {
    caller._7_1_ = uVar8;
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_f0,
               (((((fArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,true,(PVOID)0x0,false);
    local_40 = (JavascriptFunction *)0x0;
    do {
      do {
        BVar4 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_f0,&local_40,true);
        if (BVar4 == 0) {
          bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,NativeArrayConversionPhase);
          if (!bVar3) goto LAB_00b6f044;
          Output::Print(L"Conversion: Float array to Var array across ScriptContexts");
          goto LAB_00b6f03f;
        }
      } while (local_40 == (JavascriptFunction *)0x0);
      BVar4 = JavascriptFunction::IsScriptFunction(local_40);
    } while (BVar4 == 0);
    if (local_40 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x930,"(caller)","caller");
      if (!bVar3) goto LAB_00b6f111;
      *puVar5 = 0;
    }
    pFVar6 = JavascriptFunction::GetFunctionBody(local_40);
    if (pFVar6 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x931,"(caller->GetFunctionBody())","caller->GetFunctionBody()");
      if (!bVar3) goto LAB_00b6f111;
      *puVar5 = 0;
    }
    pFVar6 = JavascriptFunction::GetFunctionBody(local_40);
    walker.currentFrame.stackCheckCodeHeight._4_4_ =
         FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar6);
    pFVar6 = JavascriptFunction::GetFunctionBody(local_40);
    pFVar7 = (pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_00b6f111;
      *puVar5 = 0;
      pFVar7 = (pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,NativeArrayConversionPhase,
                              walker.currentFrame.stackCheckCodeHeight._4_4_,pFVar7->functionId);
    if (bVar3) {
      Output::Print(L"Conversion: Float array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"
                    ,(ulong)this->functionNumber,(ulong)this->callSiteNumber);
LAB_00b6f03f:
      Output::Flush();
    }
LAB_00b6f044:
    bVar3 = ScriptContext::IsScriptContextInNonDebugMode
                      ((((((fArray->super_JavascriptNativeArray).super_JavascriptArray.
                           super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.ptr)->
                         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
    if ((bVar3) && (((this->field_0).bits & 1) == 0)) {
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x94a,"(!arrayInfo->IsNativeIntArray())",
                                    "!arrayInfo->IsNativeIntArray()");
        if (!bVar3) {
LAB_00b6f111:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
    ArrayCallSiteInfo::SetIsNotNativeArray(this);
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_f0);
    uVar8 = caller._7_1_;
  }
  (fArray->super_JavascriptNativeArray).weakRefToFuncBody.ptr =
       (RecyclerWeakReference<Js::FunctionBody> *)0x0;
  ConvertToVarArray(fArray);
  pTVar1->noJsReentrancy = (bool)uVar8;
  return (JavascriptArray *)fArray;
}

Assistant:

JavascriptArray *JavascriptNativeFloatArray::ToVarArray(JavascriptNativeFloatArray *fArray)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(FloatArr_ToVarArray, reentrancylock, fArray->GetScriptContext()->GetThreadContext());
#if ENABLE_PROFILE_INFO
        ArrayCallSiteInfo *arrayInfo = fArray->GetArrayCallSiteInfo();
        if (arrayInfo)
        {
#if DBG
            Js::JavascriptStackWalker walker(fArray->GetScriptContext());
            Js::JavascriptFunction* caller = nullptr;
            bool foundScriptCaller = false;
            while(walker.GetCaller(&caller))
            {
                if(caller != nullptr && Js::ScriptFunction::Test(caller))
                {
                    foundScriptCaller = true;
                    break;
                }
            }

            if(foundScriptCaller)
            {
                Assert(caller);
                Assert(caller->GetFunctionBody());
                if(PHASE_TRACE(Js::NativeArrayConversionPhase, caller->GetFunctionBody()))
                {
                    Output::Print(_u("Conversion: Float array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"), arrayInfo->functionNumber, arrayInfo->callSiteNumber);
                    Output::Flush();
                }
            }
            else
            {
                if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
                {
                    Output::Print(_u("Conversion: Float array to Var array across ScriptContexts"));
                    Output::Flush();
                }
            }
#else
            if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
            {
                Output::Print(_u("Conversion: Float array to Var array"));
                Output::Flush();
            }
#endif

            if(fArray->GetScriptContext()->IsScriptContextInNonDebugMode())
            {
                Assert(!arrayInfo->IsNativeIntArray());
            }

            arrayInfo->SetIsNotNativeArray();
        }
#endif

        fArray->ClearArrayCallSiteIndex();

        return ConvertToVarArray(fArray);
        JIT_HELPER_END(FloatArr_ToVarArray);
    }